

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

double __thiscall PolymerWrapper::CalculatePropensity(PolymerWrapper *this)

{
  double dVar1;
  double dVar2;
  SpeciesTracker *pSVar3;
  
  if ((this->super_Reaction).remove_ == true) {
    (this->super_Reaction).old_prop_ = 0.0;
  }
  pSVar3 = SpeciesTracker::Instance();
  if ((pSVar3->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    MobileElementManager::UpdateAllPropensities
              (&((this->polymer_).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                polymerases_);
  }
  dVar1 = (((this->polymer_).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          polymerases_).prop_sum_;
  dVar2 = (this->super_Reaction).old_prop_;
  (this->super_Reaction).old_prop_ = dVar1;
  return dVar1 - dVar2;
}

Assistant:

double PolymerWrapper::CalculatePropensity() {
    if (remove_ == true) {
      old_prop_ = 0;
    }
    if (!SpeciesTracker::Instance().codon_map().empty()) {
      polymer_->UpdateAllPropensities();
    }
    double new_prop = polymer_->prop_sum() - old_prop_;
    old_prop_ = polymer_->prop_sum();
    return new_prop;
  }